

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEN.hpp
# Opt level: O1

void __thiscall ComputerEngineering::ComputerEngineering(ComputerEngineering *this)

{
  (this->super_AbstractMajor).name._M_dataplus._M_p =
       (pointer)&(this->super_AbstractMajor).name.field_2;
  (this->super_AbstractMajor).name._M_string_length = 0;
  (this->super_AbstractMajor).name.field_2._M_local_buf[0] = '\0';
  (this->super_AbstractMajor).requiredCourses.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_AbstractMajor).requiredCourses.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_AbstractMajor).requiredCourses.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_AbstractMajor)._vptr_AbstractMajor = (_func_int **)&PTR_getName_abi_cxx11__00172928;
  std::__cxx11::string::_M_replace((ulong)&(this->super_AbstractMajor).name,0,(char *)0x0,0x15c539);
  return;
}

Assistant:

ComputerEngineering() : AbstractMajor() {
            this->name = "cen";
        }